

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Appearance_PDU::Encode(Appearance_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Appearance_PDU *this_local;
  
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::operator<<(stream,(this->m_AppearanceFlag1Union).m_ui8Flag);
  if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
    KDataStream::operator<<(stream,(this->m_AppearanceFlag2Union).m_ui8Flag);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag & 1) != 0) {
    KDataStream::operator<<(stream,this->m_ui8ForceID);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 1 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_EntityType).super_DataTypeBase);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 2 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_AltEntityType).super_DataTypeBase);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 3 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_EntityMarking).super_DataTypeBase);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 4 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_EntityCapabilities).super_DataTypeBase);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 5 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_VisApp).super_DataTypeBase);
  }
  if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 6 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_IRApp).super_DataTypeBase);
  }
  if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
    if (((this->m_AppearanceFlag2Union).m_ui8Flag & 1) != 0) {
      DATA_TYPE::operator<<(stream,&(this->m_EMApp).super_DataTypeBase);
    }
    if (((this->m_AppearanceFlag2Union).m_ui8Flag >> 1 & 1) != 0) {
      DATA_TYPE::operator<<(stream,&(this->m_AudApp).super_DataTypeBase);
    }
  }
  return;
}

Assistant:

void Appearance_PDU::Encode( KDataStream & stream ) const
{
    LE_Header::Encode( stream );

    stream << m_AppearanceFlag1Union.m_ui8Flag;

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        stream << m_AppearanceFlag2Union.m_ui8Flag;
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        stream << m_ui8ForceID;
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        stream << KDIS_STREAM m_EntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        stream << KDIS_STREAM m_AltEntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        stream << KDIS_STREAM m_EntityMarking;
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        stream << KDIS_STREAM m_EntityCapabilities;
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        stream << KDIS_STREAM m_VisApp;
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        stream << KDIS_STREAM m_IRApp;
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            stream << KDIS_STREAM m_EMApp;
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            stream << KDIS_STREAM m_AudApp;
        }
    }
}